

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::INC_AB(CPU *this)

{
  uint8_t uVar1;
  uint16_t address;
  
  this->cycles = 6;
  address = GetWord(this);
  uVar1 = ReadByte(this,address);
  this->cycles = this->cycles - 1;
  WriteByte(this,address,uVar1 + 1);
  (this->field_6).ps = (this->field_6).ps & 0x7d | uVar1 + 1 & 0x80;
  return;
}

Assistant:

void CPU::INC_AB()
{
    cycles = 6;
    uint16_t addr = GetWord(), result = ReadByte(addr) + 1;
    cycles--;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}